

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign
          (CImg<unsigned_int> *this,uint *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint *puVar1;
  long lVar2;
  CImg<unsigned_int> *pCVar3;
  uint *__dest;
  ulong uVar4;
  
  uVar4 = (ulong)size_c * (ulong)size_x * (ulong)size_z * (ulong)size_y;
  if (values == (uint *)0x0 || uVar4 == 0) {
    if ((this->_is_shared == false) && (this->_data != (uint *)0x0)) {
      operator_delete__(this->_data);
    }
    this->_data = (uint *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
  }
  else {
    lVar2 = (ulong)this->_spectrum * (ulong)this->_depth *
            (ulong)this->_height * (ulong)this->_width;
    puVar1 = this->_data;
    if ((puVar1 == values) && (uVar4 - lVar2 == 0)) {
      pCVar3 = assign(this,size_x,size_y,size_z,size_c);
      return pCVar3;
    }
    if ((this->_is_shared == false) && ((puVar1 <= values + uVar4 && (values < puVar1 + lVar2)))) {
      __dest = (uint *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
      memcpy(__dest,values,uVar4 * 4);
      if (puVar1 != (uint *)0x0) {
        operator_delete__(puVar1);
      }
      this->_data = __dest;
      this->_width = size_x;
      this->_height = size_y;
      this->_depth = size_z;
      this->_spectrum = size_c;
    }
    else {
      assign(this,size_x,size_y,size_z,size_c);
      if (this->_is_shared == true) {
        memmove(this->_data,values,uVar4 * 4);
      }
      else {
        memcpy(this->_data,values,uVar4 * 4);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      const unsigned long curr_siz = size();
      if (values==_data && siz==curr_siz) return assign(size_x,size_y,size_z,size_c);
      if (_is_shared || values + siz<_data || values>=_data + size()) {
        assign(size_x,size_y,size_z,size_c);
        if (_is_shared) std::memmove(_data,values,siz*sizeof(T));
        else std::memcpy(_data,values,siz*sizeof(T));
      } else {
        T *new_data = 0;
        try { new_data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "assign(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                      size_x,size_y,size_z,size_c);
        }
        std::memcpy(new_data,values,siz*sizeof(T));
        delete[] _data; _data = new_data; _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      }
      return *this;
    }